

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::InternalFindExtensionByNumberNoLock
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  Tables *pTVar1;
  const_iterator cVar2;
  FieldDescriptor *pFVar3;
  _Base_ptr p_Var4;
  key_type local_30;
  
  if (*(int *)(extendee + 0x78) == 0) {
    return (FieldDescriptor *)0x0;
  }
  pTVar1 = (this->tables_)._M_t.
           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
  local_30.first = extendee;
  local_30.second = number;
  cVar2 = std::
          _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::find(&(pTVar1->extensions_)._M_t,&local_30);
  if ((cVar2._M_node == (_Base_ptr)((long)&(pTVar1->extensions_)._M_t + 8U)) ||
     (p_Var4 = cVar2._M_node[1]._M_left, p_Var4 == (_Base_ptr)0x0)) {
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar3 = InternalFindExtensionByNumberNoLock(this->underlay_,extendee,number),
       pFVar3 != (FieldDescriptor *)0x0)) {
      return pFVar3;
    }
    p_Var4 = (_Base_ptr)0x0;
  }
  return (FieldDescriptor *)p_Var4;
}

Assistant:

const FieldDescriptor* DescriptorPool::InternalFindExtensionByNumberNoLock(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;

  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }

  if (underlay_ != nullptr) {
    result = underlay_->InternalFindExtensionByNumberNoLock(extendee, number);
    if (result != nullptr) return result;
  }

  return nullptr;
}